

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void libdecorFrameHandleConfigure
               (libdecor_frame *frame,libdecor_configuration *config,void *userData)

{
  _Bool _Var1;
  GLFWbool GVar2;
  libdecor_state *plVar3;
  long in_RDX;
  libdecor_configuration *in_RSI;
  libdecor_frame *in_RDI;
  bool bVar4;
  float fVar5;
  GLFWbool damaged;
  libdecor_state *frameState;
  float targetRatio;
  float aspectRatio;
  GLFWbool maximized;
  GLFWbool activated;
  GLFWbool fullscreen;
  libdecor_window_state windowState;
  int height;
  int width;
  _GLFWwindow *window;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar6;
  uint local_38;
  uint local_34;
  uint local_30;
  libdecor_window_state local_2c;
  int local_28;
  int local_24;
  long local_20;
  libdecor_configuration *local_10;
  libdecor_frame *local_8;
  
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  _Var1 = (*_glfw.wl.libdecor.libdecor_configuration_get_window_state_)(in_RSI,&local_2c);
  if (_Var1) {
    local_30 = (uint)((local_2c & LIBDECOR_WINDOW_STATE_FULLSCREEN) != LIBDECOR_WINDOW_STATE_NONE);
    local_34 = (uint)((local_2c & LIBDECOR_WINDOW_STATE_ACTIVE) != LIBDECOR_WINDOW_STATE_NONE);
    local_38 = (uint)((local_2c & LIBDECOR_WINDOW_STATE_MAXIMIZED) != LIBDECOR_WINDOW_STATE_NONE);
  }
  else {
    local_30 = *(uint *)(local_20 + 0x374);
    local_34 = *(uint *)(local_20 + 0x370);
    local_38 = *(uint *)(local_20 + 0x36c);
  }
  _Var1 = (*_glfw.wl.libdecor.libdecor_configuration_get_content_size_)
                    (local_10,local_8,&local_24,&local_28);
  if (!_Var1) {
    local_24 = *(int *)(local_20 + 0x358);
    local_28 = *(int *)(local_20 + 0x35c);
  }
  if ((((local_38 == 0) && (local_30 == 0)) && (*(int *)(local_20 + 0x78) != -1)) &&
     (*(int *)(local_20 + 0x7c) != -1)) {
    fVar5 = (float)*(int *)(local_20 + 0x78) / (float)*(int *)(local_20 + 0x7c);
    if (fVar5 <= (float)local_24 / (float)local_28) {
      if (fVar5 < (float)local_24 / (float)local_28) {
        local_24 = (int)((float)local_28 * fVar5);
      }
    }
    else {
      local_28 = (int)((float)local_24 / fVar5);
    }
  }
  plVar3 = (*_glfw.wl.libdecor.libdecor_state_new_)(local_24,local_28);
  (*_glfw.wl.libdecor.libdecor_frame_commit_)(local_8,plVar3,local_10);
  (*_glfw.wl.libdecor.libdecor_state_free_)(plVar3);
  if (((*(uint *)(local_20 + 0x370) != local_34) &&
      (*(uint *)(local_20 + 0x370) = local_34, *(int *)(local_20 + 0x370) == 0)) &&
     ((*(long *)(local_20 + 0x50) != 0 && (*(int *)(local_20 + 0x10) != 0)))) {
    (*_glfw.wl.libdecor.libdecor_frame_set_minimized_)(*(libdecor_frame **)(local_20 + 0x3d8));
  }
  if (*(uint *)(local_20 + 0x36c) != local_38) {
    *(uint *)(local_20 + 0x36c) = local_38;
    _glfwInputWindowMaximize
              ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  }
  *(uint *)(local_20 + 0x374) = local_30;
  bVar4 = *(int *)(local_20 + 0x368) == 0;
  if (bVar4) {
    *(undefined4 *)(local_20 + 0x368) = 1;
  }
  uVar6 = (uint)bVar4;
  GVar2 = resizeWindow((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       0,0xa4cb13);
  if (GVar2 != 0) {
    _glfwInputWindowSize
              ((_GLFWwindow *)CONCAT44(uVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa8);
    uVar6 = 1;
  }
  if (uVar6 == 0) {
    wl_surface_commit((wl_surface *)(ulong)in_stack_ffffffffffffffb0);
  }
  else {
    _glfwInputWindowDamage((_GLFWwindow *)0xa4cb51);
  }
  return;
}

Assistant:

void libdecorFrameHandleConfigure(struct libdecor_frame* frame,
                                  struct libdecor_configuration* config,
                                  void* userData)
{
    _GLFWwindow* window = userData;
    int width, height;

    enum libdecor_window_state windowState;
    GLFWbool fullscreen, activated, maximized;

    if (libdecor_configuration_get_window_state(config, &windowState))
    {
        fullscreen = (windowState & LIBDECOR_WINDOW_STATE_FULLSCREEN) != 0;
        activated = (windowState & LIBDECOR_WINDOW_STATE_ACTIVE) != 0;
        maximized = (windowState & LIBDECOR_WINDOW_STATE_MAXIMIZED) != 0;
    }
    else
    {
        fullscreen = window->wl.fullscreen;
        activated = window->wl.activated;
        maximized = window->wl.maximized;
    }

    if (!libdecor_configuration_get_content_size(config, frame, &width, &height))
    {
        width = window->wl.width;
        height = window->wl.height;
    }

    if (!maximized && !fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    struct libdecor_state* frameState = libdecor_state_new(width, height);
    libdecor_frame_commit(frame, frameState, config);
    libdecor_state_free(frameState);

    if (window->wl.activated != activated)
    {
        window->wl.activated = activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                libdecor_frame_set_minimized(window->wl.libdecor.frame);
        }
    }

    if (window->wl.maximized != maximized)
    {
        window->wl.maximized = maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = fullscreen;

    GLFWbool damaged = GLFW_FALSE;

    if (!window->wl.visible)
    {
        window->wl.visible = GLFW_TRUE;
        damaged = GLFW_TRUE;
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);
        damaged = GLFW_TRUE;
    }

    if (damaged)
        _glfwInputWindowDamage(window);
    else
        wl_surface_commit(window->wl.surface);
}